

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::printFailureInfo(AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
                   *this,ostream *os)

{
  ostream *poVar1;
  char *in_RCX;
  Name name;
  
  poVar1 = std::operator<<(os,"Error for ");
  poVar1 = std::operator<<(poVar1,(string *)&this->txfnName);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = std::operator<<(poVar1,(string *)&this->latticeName);
  poVar1 = std::operator<<(poVar1," at lattice element seed ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," and function ");
  name.super_IString.str._M_str = in_RCX;
  name.super_IString.str._M_len = (size_t)(this->funcName).super_IString.str._M_str;
  poVar1 = operator<<((wasm *)poVar1,(ostream *)(this->funcName).super_IString.str._M_len,name);
  std::operator<<(poVar1,".\n");
  return;
}

Assistant:

void printFailureInfo(std::ostream& os) {
    os << "Error for " << txfnName << " and " << latticeName
       << " at lattice element seed " << latticeElementSeed << " and function "
       << funcName << ".\n";
  }